

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bitview_t * bwtil::load_bitview_from_file(bitview_t *bv,size_t size,FILE *fp)

{
  FILE *in_RCX;
  ulong in_RDX;
  bitview<std::vector> *in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  ulint numBytes;
  ulint x;
  ulint i;
  bitview<std::vector> *this;
  undefined1 local_30 [8];
  ulong local_28;
  FILE *local_20;
  ulong local_18;
  bitview<std::vector> *value;
  
  this = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  value = in_RDI;
  for (local_28 = 0; local_28 + 0x40 <= local_18; local_28 = local_28 + 0x40) {
    fread(local_30,8,1,local_20);
    ::bv::internal::bitview<std::vector>::set
              ((bitview<std::vector> *)numBytes,in_stack_00000008,unaff_retaddr,(word_type)value);
  }
  if (local_28 < local_18) {
    fread(local_30,8,1,local_20);
    ::bv::internal::bitview<std::vector>::set
              ((bitview<std::vector> *)numBytes,in_stack_00000008,unaff_retaddr,(word_type)value);
  }
  ::bv::internal::bitview<std::vector>::bitview(this,in_RDI);
  return this;
}

Assistant:

inline bitview_t load_bitview_from_file(bitview_t & bv, size_t size, FILE * fp){

	ulint i = 0;
	ulint x;

	ulint numBytes;

	while(i+64<=size){

		numBytes=fread(&x, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bv.set(i,i+64,x);

		i+=64;

	}

	if(i<size){

		numBytes=fread(&x, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bv.set(i,size,x);

	}

	 numBytes++;
	return bv;

}